

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_join_cluster_req(raft_server *this,req_msg *req)

{
  log_val_type lVar1;
  int32 iVar2;
  int __fd;
  element_type *peVar3;
  socklen_t *__addr_len;
  size_type sVar4;
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> *__a;
  ulong term;
  log_entry *this_02;
  element_type *this_03;
  element_type *peVar5;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar7;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *entries;
  ptr<resp_msg> *resp;
  ptr<cluster_config> *in_stack_00000568;
  raft_server *in_stack_00000570;
  __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  msg_type *in_stack_fffffffffffffef0;
  unsigned_long *in_stack_fffffffffffffef8;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  buffer *in_stack_ffffffffffffff28;
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [48];
  int32 local_38;
  undefined4 local_34;
  ulong local_30;
  undefined1 local_21;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *local_20;
  req_msg *local_18;
  
  local_18 = in_RDX;
  local_20 = req_msg::log_entries(in_RDX);
  local_21 = 0;
  peVar3 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d81d7);
  local_30 = srv_state::get_term(peVar3);
  local_34 = 0xd;
  __addr_len = (socklen_t *)(in_RSI + 0xc);
  local_38 = msg_base::get_src(&local_18->super_msg_base);
  cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (int *)in_stack_fffffffffffffee0);
  sVar4 = std::
          vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
          ::size(local_20);
  if (sVar4 == 1) {
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::operator[](local_20,0);
    this_00 = std::
              __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d826a);
    lVar1 = log_entry::get_val_type(this_00);
    if (lVar1 == conf) {
      if ((*(byte *)(in_RSI + 0x2a) & 1) == 0) {
        *(undefined1 *)(in_RSI + 0x2a) = 1;
        *(undefined4 *)(in_RSI + 0x128) = 1;
        iVar2 = msg_base::get_src(&local_18->super_msg_base);
        *(int32 *)(in_RSI + 8) = iVar2;
        *(undefined8 *)(in_RSI + 0x20) = 0;
        *(undefined8 *)(in_RSI + 0x18) = 0;
        peVar3 = std::
                 __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d84a7);
        srv_state::set_voted_for(peVar3,-1);
        peVar3 = std::
                 __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d84c7);
        term = msg_base::get_term(&local_18->super_msg_base);
        srv_state::set_term(peVar3,term);
        std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::
        operator->((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
                   0x1d84ff);
        this_02 = (log_entry *)
                  std::
                  __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d8507);
        peVar3 = std::
                 __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(in_stack_fffffffffffffee0);
        (*((_func_int **)this_02->term_)[4])(this_02,peVar3);
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::operator[](local_20,0);
        std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1d8549);
        log_entry::get_buf(this_02);
        cluster_config::deserialize(in_stack_ffffffffffffff28);
        reconfigure(in_stack_00000570,in_stack_00000568);
        std::shared_ptr<cornerstone::cluster_config>::~shared_ptr
                  ((shared_ptr<cornerstone::cluster_config> *)0x1d858d);
        this_03 = std::
                  __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d8597);
        peVar5 = std::
                 __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d85ac);
        __fd = (*peVar5->_vptr_log_store[2])();
        resp_msg::accept(this_03,__fd,__addr,__addr_len);
        _Var6._M_pi = extraout_RDX_01;
      }
      else {
        __a = (allocator<char> *)
              std::
              __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d8394);
        __s = &local_91;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff20,(char *)__s,__a);
        (**(code **)(*(long *)__a + 0x18))(__a,local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
        _Var6._M_pi = extraout_RDX_00;
      }
      goto LAB_001d8607;
    }
  }
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d8296);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  (**(code **)(*(long *)this_01 + 0x18))(this_01,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  _Var6._M_pi = extraout_RDX;
LAB_001d8607:
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_join_cluster_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::join_cluster_response, id_, req.get_src()));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::conf)
    {
        l_->info("receive an invalid JoinClusterRequest as the log entry value doesn't meet the requirements");
        return resp;
    }

    if (catching_up_)
    {
        l_->info("this server is already in log syncing mode");
        return resp;
    }

    catching_up_ = true;
    role_ = srv_role::follower;
    leader_ = req.get_src();
    sm_commit_index_ = 0;
    quick_commit_idx_ = 0;
    state_->set_voted_for(-1);
    state_->set_term(req.get_term());
    ctx_->state_mgr_->save_state(*state_);
    reconfigure(cluster_config::deserialize(entries[0]->get_buf()));
    resp->accept(log_store_->next_slot());
    return resp;
}